

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_sid.cpp
# Opt level: O0

string * __thiscall cppcms::sessions::session_sid::get_new_sid_abi_cxx11_(session_sid *this)

{
  undefined8 in_RSI;
  uint len;
  string *in_RDI;
  urandom_device *unaff_retaddr;
  urandom_device rnd;
  char res [33];
  char sid [16];
  allocator *this_00;
  string *psVar1;
  allocator local_6d [21];
  char local_58 [48];
  undefined1 local_28 [28];
  string *ptr;
  
  len = (uint)((ulong)in_RSI >> 0x20);
  psVar1 = in_RDI;
  ptr = in_RDI;
  urandom_device::urandom_device((urandom_device *)in_RDI);
  urandom_device::generate(unaff_retaddr,ptr,len);
  cppcms::impl::tohex(local_28,0x10,local_58);
  this_00 = local_6d;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,local_58,this_00);
  std::allocator<char>::~allocator((allocator<char> *)local_6d);
  urandom_device::~urandom_device((urandom_device *)this_00);
  return psVar1;
}

Assistant:

std::string session_sid::get_new_sid()
{
	char sid[16];			
	char res[33];
	urandom_device rnd;
	rnd.generate(sid,sizeof(sid));
	cppcms::impl::tohex(sid,sizeof(sid),res);
	return res;
}